

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

bool CoreML::Specification::operator==(CustomModel *a,CustomModel *b)

{
  string *psVar1;
  string *psVar2;
  size_t __n;
  int iVar3;
  
  psVar1 = (a->classname_).ptr_;
  psVar2 = (b->classname_).ptr_;
  __n = psVar1->_M_string_length;
  if (__n != psVar2->_M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar3 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n);
    return iVar3 == 0;
  }
  return true;
}

Assistant:

inline const ::std::string& GetNoArena() const { return *ptr_; }